

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUSSEImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUSSEImpl<double,_1,_1>::calcEdgeLogLikelihoods
          (BeagleCPUSSEImpl<double,_1,_1> *this,int parIndex,int childIndex,int probIndex,
          int categoryWeightsIndex,int stateFrequenciesIndex,int scalingFactorsIndex,
          double *outSumLogLikelihood)

{
  int iVar1;
  
  iVar1 = BeagleCPUImpl<double,_1,_1>::calcEdgeLogLikelihoods
                    (&this->super_BeagleCPUImpl<double,_1,_1>,parIndex,childIndex,probIndex,
                     categoryWeightsIndex,stateFrequenciesIndex,scalingFactorsIndex,
                     outSumLogLikelihood);
  return iVar1;
}

Assistant:

BEAGLE_CPU_SSE_TEMPLATE
int BeagleCPUSSEImpl<BEAGLE_CPU_SSE_DOUBLE>::calcEdgeLogLikelihoods(const int parIndex,
                                                           const int childIndex,
                                                           const int probIndex,
                                                           const int categoryWeightsIndex,
                                                           const int stateFrequenciesIndex,
                                                           const int scalingFactorsIndex,
                                                           double* outSumLogLikelihood) {
return BeagleCPUImpl<BEAGLE_CPU_SSE_DOUBLE>::calcEdgeLogLikelihoods(
                                                    parIndex,
                                                    childIndex,
                                                    probIndex,
                                                    categoryWeightsIndex,
                                                    stateFrequenciesIndex,
                                                    scalingFactorsIndex,
                                                    outSumLogLikelihood);
}